

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_config_matches(ssl_primary_config *data,ssl_primary_config *needle)

{
  int iVar1;
  
  if (((((data->version == needle->version) && (data->version_max == needle->version_max)) &&
       (data->verifypeer == needle->verifypeer)) &&
      ((((data->verifyhost == needle->verifyhost && (data->verifystatus == needle->verifystatus)) &&
        ((iVar1 = Curl_safe_strcasecompare(data->CApath,needle->CApath), iVar1 != 0 &&
         ((iVar1 = Curl_safe_strcasecompare(data->CAfile,needle->CAfile), iVar1 != 0 &&
          (iVar1 = Curl_safe_strcasecompare(data->clientcert,needle->clientcert), iVar1 != 0))))))
       && (iVar1 = Curl_safe_strcasecompare(data->random_file,needle->random_file), iVar1 != 0))))
     && (((iVar1 = Curl_safe_strcasecompare(data->egdsocket,needle->egdsocket), iVar1 != 0 &&
          (iVar1 = Curl_safe_strcasecompare(data->cipher_list,needle->cipher_list), iVar1 != 0)) &&
         (iVar1 = Curl_safe_strcasecompare(data->cipher_list13,needle->cipher_list13), iVar1 != 0)))
     ) {
    return true;
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_primary_config* data,
                        struct ssl_primary_config* needle)
{
  if((data->version == needle->version) &&
     (data->version_max == needle->version_max) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     (data->verifystatus == needle->verifystatus) &&
     Curl_safe_strcasecompare(data->CApath, needle->CApath) &&
     Curl_safe_strcasecompare(data->CAfile, needle->CAfile) &&
     Curl_safe_strcasecompare(data->clientcert, needle->clientcert) &&
     Curl_safe_strcasecompare(data->random_file, needle->random_file) &&
     Curl_safe_strcasecompare(data->egdsocket, needle->egdsocket) &&
     Curl_safe_strcasecompare(data->cipher_list, needle->cipher_list) &&
     Curl_safe_strcasecompare(data->cipher_list13, needle->cipher_list13))
    return TRUE;

  return FALSE;
}